

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O2

void __thiscall
cfd::core::
JsonObjectVector<cfd::js::api::json::PsbtGlobalXpubInput,_cfd::js::api::PsbtGlobalXpubInputStruct>::
ConvertFromStruct(JsonObjectVector<cfd::js::api::json::PsbtGlobalXpubInput,_cfd::js::api::PsbtGlobalXpubInputStruct>
                  *this,vector<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
                        *list)

{
  pointer pPVar1;
  pointer data;
  PsbtGlobalXpubInput object;
  PsbtGlobalXpubInput PStack_d8;
  
  pPVar1 = (list->
           super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (data = (list->
              super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
              )._M_impl.super__Vector_impl_data._M_start; data != pPVar1; data = data + 1) {
    js::api::json::PsbtGlobalXpubInput::PsbtGlobalXpubInput(&PStack_d8);
    js::api::json::PsbtGlobalXpubInput::ConvertFromStruct(&PStack_d8,data);
    std::
    vector<cfd::js::api::json::PsbtGlobalXpubInput,_std::allocator<cfd::js::api::json::PsbtGlobalXpubInput>_>
    ::push_back(&(this->super_JsonVector<cfd::js::api::json::PsbtGlobalXpubInput>).
                 super_vector<cfd::js::api::json::PsbtGlobalXpubInput,_std::allocator<cfd::js::api::json::PsbtGlobalXpubInput>_>
                ,&PStack_d8);
    js::api::json::PsbtGlobalXpubInput::~PsbtGlobalXpubInput(&PStack_d8);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }